

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O3

void __thiscall
duckdb::BindContext::AddCTEBinding
          (BindContext *this,idx_t index,string *alias,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,vector<duckdb::LogicalType,_true> *types,bool using_key)

{
  case_insensitive_map_t<shared_ptr<Binding>_> *this_00;
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Binding *pBVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  mapped_type *pmVar9;
  BinderException *this_01;
  undefined7 in_register_00000089;
  Binding *__tmp;
  Binding *__tmp_2;
  undefined1 local_14d;
  BindingType local_14c;
  BindContext *local_148;
  undefined4 local_13c;
  Binding *local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> recurring_alias;
  idx_t index_local;
  vector<duckdb::LogicalType,_true> *local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_f8;
  BindingAlias local_f0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_138 = (Binding *)((ulong)local_138 & 0xffffffff00000000);
  pcVar1 = (alias->_M_dataplus)._M_p;
  local_148 = this;
  index_local = index;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + alias->_M_string_length);
  BindingAlias::BindingAlias(&local_f0,&local_50);
  local_13c = (undefined4)CONCAT71(in_register_00000089,using_key);
  recurring_alias._M_dataplus._M_p = (pointer)0x0;
  local_f8 = names;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::Binding,std::allocator<duckdb::Binding>,duckdb::BindingType,duckdb::BindingAlias,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::vector<std::__cxx11::string,true>const&,unsigned_long&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&recurring_alias._M_string_length,
             (Binding **)&recurring_alias,(allocator<duckdb::Binding> *)&local_14c,
             (BindingType *)&local_138,&local_f0,types,names,&index_local);
  sVar5 = recurring_alias._M_string_length;
  _Var4 = recurring_alias._M_dataplus;
  if (recurring_alias._M_string_length != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(recurring_alias._M_string_length + 8) =
           *(int *)(recurring_alias._M_string_length + 8) + 1;
      UNLOCK();
      if (recurring_alias._M_string_length == 0) goto LAB_0121bdf7;
    }
    else {
      *(int *)(recurring_alias._M_string_length + 8) =
           *(int *)(recurring_alias._M_string_length + 8) + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)recurring_alias._M_string_length);
  }
LAB_0121bdf7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.alias._M_dataplus._M_p != &local_f0.alias.field_2) {
    operator_delete(local_f0.alias._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.schema._M_dataplus._M_p != &local_f0.schema.field_2) {
    operator_delete(local_f0.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.catalog._M_dataplus._M_p != &local_f0.catalog.field_2) {
    operator_delete(local_f0.catalog._M_dataplus._M_p);
  }
  local_100 = types;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  this_00 = &local_148->cte_bindings;
  iVar6 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,alias);
  if (iVar6.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    this_01 = (BinderException *)__cxa_allocate_exception(0x10);
    local_f0.catalog._M_dataplus._M_p = (pointer)&local_f0.catalog.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"Duplicate CTE binding \"%s\" in query!","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    pcVar1 = (alias->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + alias->_M_string_length);
    BinderException::BinderException<std::__cxx11::string>(this_01,&local_f0.catalog,&local_70);
    __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pmVar7 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,alias);
  (pmVar7->internal).super___shared_ptr<duckdb::Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var4._M_p;
  p_Var8 = (pmVar7->internal).super___shared_ptr<duckdb::Binding,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (pmVar7->internal).super___shared_ptr<duckdb::Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5;
  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
  }
  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var8->_M_use_count = 1;
  p_Var8->_M_weak_count = 1;
  p_Var8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0244f120;
  p_Var8[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var8->_M_use_count = 2;
  }
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
  pmVar9 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)local_148,alias);
  (pmVar9->internal).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var8 + 1);
  p_Var2 = (pmVar9->internal).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (pmVar9->internal).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var8;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if ((char)local_13c == '\0') {
    return;
  }
  ::std::operator+(&recurring_alias,"recurring.",alias);
  local_14c = BASE;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,recurring_alias._M_dataplus._M_p,
             recurring_alias._M_dataplus._M_p + recurring_alias._M_string_length);
  BindingAlias::BindingAlias(&local_f0,&local_90);
  local_138 = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::Binding,std::allocator<duckdb::Binding>,duckdb::BindingType,duckdb::BindingAlias,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::vector<std::__cxx11::string,true>const&,unsigned_long&>
            (&local_130,&local_138,(allocator<duckdb::Binding> *)&local_14d,&local_14c,&local_f0,
             local_100,local_f8,&index_local);
  pBVar3 = local_138;
  if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_130._M_pi)->_M_use_count = (local_130._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_130._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0121bfdf;
    }
    else {
      (local_130._M_pi)->_M_use_count = (local_130._M_pi)->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
  }
LAB_0121bfdf:
  pmVar7 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,&recurring_alias);
  (pmVar7->internal).super___shared_ptr<duckdb::Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pBVar3
  ;
  p_Var8 = (pmVar7->internal).super___shared_ptr<duckdb::Binding,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (pmVar7->internal).super___shared_ptr<duckdb::Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_130._M_pi;
  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.alias._M_dataplus._M_p != &local_f0.alias.field_2) {
    operator_delete(local_f0.alias._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.schema._M_dataplus._M_p != &local_f0.schema.field_2) {
    operator_delete(local_f0.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.catalog._M_dataplus._M_p != &local_f0.catalog.field_2) {
    operator_delete(local_f0.catalog._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var8->_M_use_count = 1;
  p_Var8->_M_weak_count = 1;
  p_Var8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0244f120;
  p_Var8[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var8->_M_use_count = 2;
  }
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
  pmVar9 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)local_148,&recurring_alias);
  (pmVar9->internal).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var8 + 1);
  p_Var2 = (pmVar9->internal).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (pmVar9->internal).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var8;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)recurring_alias._M_dataplus._M_p != &recurring_alias.field_2) {
    operator_delete(recurring_alias._M_dataplus._M_p);
  }
  return;
}

Assistant:

void BindContext::AddCTEBinding(idx_t index, const string &alias, const vector<string> &names,
                                const vector<LogicalType> &types, bool using_key) {
	auto binding = make_shared_ptr<Binding>(BindingType::BASE, BindingAlias(alias), types, names, index);

	if (cte_bindings.find(alias) != cte_bindings.end()) {
		throw BinderException("Duplicate CTE binding \"%s\" in query!", alias);
	}
	cte_bindings[alias] = std::move(binding);
	cte_references[alias] = make_shared_ptr<idx_t>(0);

	if (using_key) {
		auto recurring_alias = "recurring." + alias;
		cte_bindings[recurring_alias] =
		    make_shared_ptr<Binding>(BindingType::BASE, BindingAlias(recurring_alias), types, names, index);
		cte_references[recurring_alias] = make_shared_ptr<idx_t>(0);
	}
}